

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# git-identity.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ulong uVar1;
  iterator *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer pcVar2;
  char cVar3;
  int iVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  char *pcVar5;
  long *plVar6;
  ulong uVar7;
  reference pvVar8;
  reference pvVar9;
  string *psVar10;
  reference pbVar11;
  ulong *puVar12;
  pointer pbVar13;
  undefined1 auVar14 [8];
  long *plVar15;
  size_type *psVar16;
  size_t sVar17;
  uint uVar18;
  _Alloc_hider __s;
  long lVar19;
  bool bVar20;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  gitEmail;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  gitName;
  string choiceStr;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  json;
  string email;
  string value;
  string key;
  value_type identity;
  iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  __begin2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string homepath;
  ifstream jsonFile;
  ulong local_488;
  undefined1 local_480 [8];
  undefined1 local_478 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  undefined1 local_448 [8];
  json_value local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  undefined1 local_3f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  long *local_3d0;
  long local_3c8;
  long local_3c0;
  long lStack_3b8;
  long *local_3b0;
  long local_3a8;
  long local_3a0;
  long lStack_398;
  undefined1 local_390 [16];
  undefined1 local_380 [24];
  primitive_iterator_t pStack_368;
  size_t local_360;
  _Alloc_hider local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  _Alloc_hider local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_310;
  undefined1 local_308 [48];
  _Alloc_hider local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  _Alloc_hider local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  long *local_278;
  long local_270;
  long local_268 [2];
  _Any_data local_258;
  code *local_248;
  undefined8 uStack_240;
  _Rb_tree_node_base local_238 [7];
  undefined8 auStack_150 [36];
  
  lVar19 = (long)local_238 + 0x10;
  local_238[0]._0_8_ = lVar19;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"config --local user.name","")
  ;
  git((string *)local_478);
  if (local_238[0]._0_8_ != lVar19) {
    operator_delete((void *)local_238[0]._0_8_,(long)local_238[0]._M_left + 1);
  }
  local_238[0]._0_8_ = lVar19;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_238,"config --local user.email","");
  git((string *)local_480);
  if (local_238[0]._0_8_ != lVar19) {
    operator_delete((void *)local_238[0]._0_8_,(long)local_238[0]._M_left + 1);
  }
  if ((argc < 2) || (iVar4 = strcmp(argv[1],"check"), iVar4 != 0)) {
    pcVar5 = getenv("HOME");
    std::__cxx11::string::string((string *)&local_278,pcVar5,(allocator *)local_238);
    local_308._0_8_ = (pointer)(local_308 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_308,local_278,local_270 + (long)local_278);
    std::__cxx11::string::append(local_308);
    plVar6 = (long *)std::__cxx11::string::append(local_308);
    pbVar13 = (pointer)(plVar6 + 2);
    if ((pointer)*plVar6 == pbVar13) {
      local_380._16_8_ = *(undefined8 *)&pbVar13->m_type;
      pStack_368.m_it = plVar6[3];
      local_380._0_8_ = (pointer)(local_380 + 0x10);
    }
    else {
      local_380._16_8_ = *(undefined8 *)&pbVar13->m_type;
      local_380._0_8_ = (pointer)*plVar6;
    }
    local_380._8_8_ = plVar6[1];
    *plVar6 = (long)pbVar13;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::ifstream::ifstream(local_238,(string *)local_380,_S_in);
    if ((pointer)local_380._0_8_ != (pointer)(local_380 + 0x10)) {
      operator_delete((void *)local_380._0_8_,(ulong)(local_380._16_8_ + 1));
    }
    if ((pointer)local_308._0_8_ != (pointer)(local_308 + 0x10)) {
      operator_delete((void *)local_308._0_8_,(ulong)(local_308._16_8_ + 1));
    }
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 == '\0') {
      main_cold_1();
    }
    else {
      local_380._8_8_ = operator_new(0x28);
      ((_Base_ptr)local_380._8_8_)->_M_parent = (_Base_ptr)0x100000001;
      *(undefined ***)local_380._8_8_ = &PTR___Sp_counted_ptr_inplace_00118af0;
      local_380._0_8_ = &((_Base_ptr)local_380._8_8_)->_M_left;
      ((_Base_ptr)local_380._8_8_)->_M_left = (_Base_ptr)&PTR_get_character_00118ba0;
      ((_Base_ptr)local_380._8_8_)->_M_right = local_238;
      *(undefined8 *)(local_380._8_8_ + 0x20) =
           *(undefined8 *)((long)auStack_150 + (long)*(_Base_ptr *)(local_238[0]._0_8_ + -0x18));
      local_258._M_unused._M_object = (void *)0x0;
      local_258._8_8_ = 0;
      local_248 = (code *)0x0;
      uStack_240 = 0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               *)local_448,(input_adapter *)local_380,(parser_callback_t *)&local_258,true);
      if (local_248 != (code *)0x0) {
        (*local_248)(&local_258,&local_258,__destroy_functor);
      }
      if ((_Base_ptr)local_380._8_8_ != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_380._8_8_);
      }
      pcVar5 = local_3e8._M_local_buf + 8;
      __return_storage_ptr__ = (iterator *)(local_3f8 + 8);
      local_478._8_8_ = 0;
      local_488 = 0;
      while( true ) {
        uVar7 = (ulong)local_448[0];
        if (local_448[0] != null) {
          if (local_448[0] == object) {
            uVar7 = ((local_440.object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
          }
          else if (local_448[0] == array) {
            uVar7 = (long)((local_440.array)->
                          super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)((local_440.array)->
                          super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 4;
          }
          else {
            uVar7 = 1;
          }
        }
        if (uVar7 <= local_488) break;
        pvVar8 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                               *)local_448,local_488);
        pvVar9 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)pvVar8,"user.name");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_468,
                   pvVar9);
        pvVar9 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)pvVar8,"user.email");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_438,pvVar9);
        if ((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_478._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
            (local_480 != (undefined1  [8])0x0)) &&
           (local_468._8_8_ == *(size_type *)(local_478._0_8_ + 8))) {
          auVar14 = local_480;
          if (local_468._8_8_ != 0) {
            local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_480;
            iVar4 = bcmp((void *)local_468._M_allocated_capacity,*(void **)local_478._0_8_,
                         local_468._8_8_);
            auVar14 = (undefined1  [8])local_310;
            if (iVar4 != 0) goto LAB_00103bc6;
          }
          if (local_438._M_string_length ==
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auVar14)->
              _M_string_length) {
            if (local_438._M_string_length == 0) {
              bVar20 = true;
            }
            else {
              iVar4 = bcmp(local_438._M_dataplus._M_p,
                           (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            auVar14)->_M_dataplus)._M_p,local_438._M_string_length);
              bVar20 = iVar4 == 0;
            }
          }
          else {
            bVar20 = false;
          }
          if (bVar20) {
            local_478._8_8_ = local_488 + 1;
          }
        }
LAB_00103bc6:
        local_488 = local_488 + 1;
        printf("(%zu) %s <%s>\n",local_488,local_468._M_allocated_capacity,
               local_438._M_dataplus._M_p);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::begin((iterator *)local_308,pvVar8);
        nlohmann::detail::
        iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::iteration_proxy_value
                  ((iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                    *)local_380,
                   (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                    *)local_308);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::end(__return_storage_ptr__,pvVar8);
        nlohmann::detail::
        iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::iteration_proxy_value
                  ((iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                    *)local_308,__return_storage_ptr__);
        while (bVar20 = nlohmann::detail::
                        iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                      *)local_380,
                                     (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                      *)local_308), !bVar20) {
          psVar10 = nlohmann::detail::
                    iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                    ::key((iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                           *)local_380);
          pcVar2 = (psVar10->_M_dataplus)._M_p;
          local_3f8._8_8_ = pcVar5;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__return_storage_ptr__,pcVar2,pcVar2 + psVar10->_M_string_length);
          iVar4 = std::__cxx11::string::compare((char *)__return_storage_ptr__);
          if ((iVar4 != 0) &&
             (iVar4 = std::__cxx11::string::compare((char *)__return_storage_ptr__), iVar4 != 0)) {
            pbVar11 = nlohmann::detail::
                      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                      ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                   *)local_380);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::
            get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_418,pbVar11);
            printf("    %s",local_3f8._8_8_);
            if (local_3e8._M_allocated_capacity < 0x14) {
              lVar19 = 0;
              do {
                putchar(0x20);
                lVar19 = lVar19 + 1;
              } while (local_3e8._M_allocated_capacity + lVar19 < 0x14);
            }
            __s._M_p = "<empty>";
            if (local_418._M_string_length != 0) {
              __s._M_p = local_418._M_dataplus._M_p;
            }
            puts(__s._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_dataplus._M_p != &local_418.field_2) {
              operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((char *)local_3f8._8_8_ != pcVar5) {
            operator_delete((void *)local_3f8._8_8_,local_3e8._8_8_ + 1);
          }
          nlohmann::detail::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator++((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_380);
          local_360 = local_360 + 1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_p != &local_2a8) {
          operator_delete(local_2b8._M_p,local_2a8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_p != &local_2c8) {
          operator_delete(local_2d8._M_p,local_2c8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_p != &local_320) {
          operator_delete(local_330._M_p,local_320._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_p != &local_340) {
          operator_delete(local_350._M_p,local_340._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_468._M_allocated_capacity != &local_458) {
          operator_delete((void *)local_468._M_allocated_capacity,
                          CONCAT71(local_458._M_allocated_capacity._1_7_,local_458._M_local_buf[0])
                          + 1);
        }
      }
      if (local_478._8_8_ == 0) {
        printf("\nYour choice: ");
      }
      else {
        printf("\nYour choice (%zu): ");
      }
      local_468._M_allocated_capacity = (size_type)&local_458;
      local_468._8_8_ = 0;
      local_458._M_local_buf[0] = '\0';
      cVar3 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '0');
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)local_468._M_local_buf,cVar3);
      if ((local_468._8_8_ == 0) && (local_478._8_8_ != 0)) {
        puVar12 = (ulong *)operator_new(8);
        *puVar12 = local_478._8_8_;
      }
      else if (local_468._8_8_ == 0) {
        puVar12 = (ulong *)0x0;
      }
      else {
        puVar12 = (ulong *)0x0;
        sVar17 = 0;
        uVar7 = 0;
        do {
          uVar18 = (int)*(char *)(local_468._M_allocated_capacity + sVar17) - 0x30;
          if ((9 < uVar18) || (uVar1 = (ulong)uVar18 + uVar7 * 10, uVar1 < uVar7))
          goto LAB_00103ee6;
          sVar17 = sVar17 + 1;
          uVar7 = uVar1;
        } while (local_468._8_8_ != sVar17);
        puVar12 = (ulong *)operator_new(8);
        *puVar12 = uVar1;
      }
LAB_00103ee6:
      if ((puVar12 == (ulong *)0x0) || (*puVar12 == 0)) {
LAB_001043b8:
        main_cold_2();
      }
      else {
        uVar7 = (ulong)local_448[0];
        if (local_448[0] != null) {
          if (local_448[0] == object) {
            uVar7 = ((local_440.object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
          }
          else if (local_448[0] == array) {
            uVar7 = (long)((local_440.array)->
                          super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)((local_440.array)->
                          super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 4;
          }
          else {
            uVar7 = 1;
          }
        }
        if (uVar7 < *puVar12) goto LAB_001043b8;
        pvVar8 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                               *)local_448,*puVar12 - 1);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_390,pvVar8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::begin((iterator *)local_308,
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_390);
        nlohmann::detail::
        iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::iteration_proxy_value
                  ((iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                    *)local_380,(iterator *)local_308);
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_3f8 + 8)
        ;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::end((iterator *)__rhs,
              (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               *)local_390);
        nlohmann::detail::
        iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::iteration_proxy_value
                  ((iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                    *)local_308,
                   (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                    *)__rhs);
        while (bVar20 = nlohmann::detail::
                        iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                      *)local_380,
                                     (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                      *)local_308), !bVar20) {
          psVar10 = nlohmann::detail::
                    iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                    ::key((iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                           *)local_380);
          pcVar2 = (psVar10->_M_dataplus)._M_p;
          local_3f8._8_8_ = pcVar5;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__rhs,pcVar2,pcVar2 + psVar10->_M_string_length);
          pbVar11 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                 *)local_380);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_438,pbVar11);
          std::operator+(&local_298,"config \"",__rhs);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_298);
          plVar15 = plVar6 + 2;
          if ((long *)*plVar6 == plVar15) {
            local_3c0 = *plVar15;
            lStack_3b8 = plVar6[3];
            local_3d0 = &local_3c0;
          }
          else {
            local_3c0 = *plVar15;
            local_3d0 = (long *)*plVar6;
          }
          local_3c8 = plVar6[1];
          *plVar6 = (long)plVar15;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_3d0,(ulong)local_438._M_dataplus._M_p);
          plVar15 = plVar6 + 2;
          if ((long *)*plVar6 == plVar15) {
            local_3a0 = *plVar15;
            lStack_398 = plVar6[3];
            local_3b0 = &local_3a0;
          }
          else {
            local_3a0 = *plVar15;
            local_3b0 = (long *)*plVar6;
          }
          local_3a8 = plVar6[1];
          *plVar6 = (long)plVar15;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_3b0);
          local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
          psVar16 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_418.field_2._M_allocated_capacity = *psVar16;
            local_418.field_2._8_8_ = plVar6[3];
          }
          else {
            local_418.field_2._M_allocated_capacity = *psVar16;
            local_418._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_418._M_string_length = plVar6[1];
          *plVar6 = (long)psVar16;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          git((string *)local_3f8);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_3f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3f8._0_8_);
          }
          local_3f8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) {
            operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
          }
          if (local_3b0 != &local_3a0) {
            operator_delete(local_3b0,local_3a0 + 1);
          }
          if (local_3d0 != &local_3c0) {
            operator_delete(local_3d0,local_3c0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._M_dataplus._M_p != &local_438.field_2) {
            operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
          }
          if ((char *)local_3f8._8_8_ != pcVar5) {
            operator_delete((void *)local_3f8._8_8_,local_3e8._8_8_ + 1);
          }
          nlohmann::detail::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator++((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_380);
          local_360 = local_360 + 1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_p != &local_2a8) {
          operator_delete(local_2b8._M_p,local_2a8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_p != &local_2c8) {
          operator_delete(local_2d8._M_p,local_2c8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_p != &local_320) {
          operator_delete(local_330._M_p,local_320._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_p != &local_340) {
          operator_delete(local_350._M_p,local_340._M_allocated_capacity + 1);
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_390);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(local_390 + 8),local_390[0]);
      }
      if (puVar12 != (ulong *)0x0) {
        operator_delete(puVar12,8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_allocated_capacity != &local_458) {
        operator_delete((void *)local_468._M_allocated_capacity,
                        CONCAT71(local_458._M_allocated_capacity._1_7_,local_458._M_local_buf[0]) +
                        1);
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_448);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_448 + 8),local_448[0]);
    }
    std::ifstream::~ifstream(local_238);
    if (local_278 != local_268) {
      operator_delete(local_278,local_268[0] + 1);
    }
  }
  else {
    if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_478._0_8_ !=
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
       (local_480 != (undefined1  [8])0x0)) {
      iVar4 = 0;
      fprintf(_stderr,"%s <%s>\n",*(undefined8 *)local_478._0_8_,*(undefined8 *)local_480);
      goto LAB_0010437c;
    }
    main_cold_3();
  }
  iVar4 = 1;
LAB_0010437c:
  if (local_480 != (undefined1  [8])0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_480,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_480);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_478._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_478,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_478._0_8_);
  }
  return iVar4;
}

Assistant:

int main(int argc, char* argv[])
{
	auto gitName = git("config --local user.name");
	auto gitEmail = git("config --local user.email");

	if(argc > 1 && strcmp(argv[1], "check") == 0)
	{
		if(gitName && gitEmail)
		{
			fprintf(stderr, "%s <%s>\n", gitName->c_str(), gitEmail->c_str());
			return EXIT_SUCCESS;
		}
		else
		{
			fprintf(stderr, "Name or email not set!\n");
			return EXIT_FAILURE;
		}
	}

	std::string homepath = getenv("HOME");
	auto jsonFilename = "git-identity.json";
	std::ifstream jsonFile(homepath + "/" + jsonFilename);
	if(!jsonFile.is_open())
	{
		fprintf(stderr, "Failed to open '%s'!\n", jsonFilename);
		return EXIT_FAILURE;
	}

	auto json = nlohmann::json::parse(jsonFile);

	size_t defaultChoice = 0;
	for(size_t i = 0; i < json.size(); i++)
	{
		auto& identity = json[i];
		std::string name = identity["user.name"];
		std::string email = identity["user.email"];
		if(gitName && gitEmail && name == *gitName && email == *gitEmail)
			defaultChoice = i + 1;
		printf("(%zu) %s <%s>\n", i + 1, name.c_str(), email.c_str());
		for(auto& el : identity.items())
		{
			std::string key = el.key();
			if(key == "user.name" || key == "user.email")
				continue;
			std::string value = el.value();
			printf("    %s", key.c_str());
			for(size_t i = 0; i + key.length() < 20; i++)
				printf(" ");
			printf("%s\n", value.empty() ? "<empty>" : value.c_str());
		}
	}

	if(defaultChoice)
		printf("\nYour choice (%zu): ", defaultChoice);
	else
		printf("\nYour choice: ");

	std::string choiceStr;
	std::getline(std::cin, choiceStr);

	auto choice = (choiceStr.empty() && defaultChoice > 0) ? std::make_unique<size_t>(defaultChoice) : parseSize(choiceStr);
	if(!choice || *choice == 0 || *choice > json.size())
	{
		fprintf(stderr, "Invalid choice '%s'!\n", choiceStr.c_str());
		return EXIT_FAILURE;
	}

	auto identity = json[*choice - 1];
	for(auto& el : identity.items())
	{
		std::string key = el.key();
		std::string value = el.value();
		git("config \"" + key + "\" \"" + value + "\"");
	}

	return EXIT_FAILURE;
}